

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O3

Id dxil_spv::build_vectorized_physical_load_store_access
             (Impl *impl,CallInst *instruction,uint vecsize,Type *element_type)

{
  uint uVar1;
  bool bVar2;
  Id IVar3;
  Value *pVVar4;
  mapped_type *pmVar5;
  Value *byte_offset;
  BufferAccessInfo BVar6;
  Id ptr_id;
  Id local_34;
  
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_34 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&impl->handle_to_resource_meta,&local_34);
  uVar1 = pmVar5->stride;
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  if (uVar1 == 0) {
    bVar2 = raw_access_byte_address_can_vectorize(impl,element_type,pVVar4,vecsize);
  }
  else {
    uVar1 = pmVar5->stride;
    byte_offset = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
    bVar2 = raw_access_structured_can_vectorize(impl,element_type,pVVar4,uVar1,byte_offset,vecsize);
  }
  IVar3 = 0;
  if (bVar2 != false) {
    BVar6 = build_buffer_access(impl,instruction,0,0,element_type,~(-1 << ((byte)vecsize & 0x1f)));
    IVar3 = BVar6.index_id;
  }
  return IVar3;
}

Assistant:

static spv::Id build_vectorized_physical_load_store_access(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                           unsigned vecsize, const llvm::Type *element_type)
{
	spv::Id ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[ptr_id];
	unsigned mask = (1u << vecsize) - 1u;

	// If we can express this as a plain access chain, do so for clarity and ideally better perf.
	// If we cannot do it trivially, fallback to raw pointer arithmetic.
	bool can_vectorize = false;

	if (meta.stride)
	{
		if (raw_access_structured_can_vectorize(impl, element_type,
		                                        instruction->getOperand(2), meta.stride,
		                                        instruction->getOperand(3), vecsize))
		{
			can_vectorize = true;
		}
	}
	else if (raw_access_byte_address_can_vectorize(impl, element_type,
	                                               instruction->getOperand(2), vecsize))
	{
		can_vectorize = true;
	}

	if (can_vectorize)
	{
		auto access = build_buffer_access(impl, instruction, 0, 0, element_type, mask);
		return access.index_id;
	}
	else
		return 0;
}